

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

void __thiscall chaiscript::Boxed_Number::Boxed_Number(Boxed_Number *this,Boxed_Value *v)

{
  Boxed_Value *v_local;
  Boxed_Number *this_local;
  
  Boxed_Value::Boxed_Value(&this->bv,v);
  validate_boxed_number(&this->bv);
  return;
}

Assistant:

explicit Boxed_Number(Boxed_Value v)
        : bv(std::move(v)) {
      validate_boxed_number(bv);
    }